

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

bool __thiscall tinyusdz::value::TimeSamples::get_sample_at(TimeSamples *this,double t,Sample **dst)

{
  Sample *pSVar1;
  Sample *pSVar2;
  Sample *pSVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (dst == (Sample **)0x0) {
    return false;
  }
  if (this->_dirty == true) {
    update(this);
  }
  pSVar3 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pSVar1 - (long)pSVar3;
  lVar4 = (lVar5 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar4) {
    dVar10 = ABS(t);
    pSVar2 = pSVar3 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    pSVar3 = pSVar3 + 2;
    uVar6 = -(ulong)NAN(dVar10);
    do {
      dVar8 = ABS(t - pSVar3[-2].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_0017b68c:
        pSVar3 = pSVar3 + -2;
        goto LAB_0017b69f;
      }
      dVar9 = ABS(pSVar3[-2].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_0017b68c;
      dVar8 = ABS(t - pSVar3[-1].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_0017b692:
        pSVar3 = pSVar3 + -1;
        goto LAB_0017b69f;
      }
      dVar9 = ABS(pSVar3[-1].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_0017b692;
      dVar8 = ABS(t - pSVar3->t);
      if (dVar8 <= 2.220446049250313e-16) goto LAB_0017b69f;
      dVar9 = ABS(pSVar3->t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_0017b69f;
      dVar8 = ABS(t - pSVar3[1].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_0017b698:
        pSVar3 = pSVar3 + 1;
        goto LAB_0017b69f;
      }
      dVar9 = ABS(pSVar3[1].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_0017b698;
      lVar4 = lVar4 + -1;
      pSVar3 = pSVar3 + 4;
    } while (1 < lVar4);
    lVar5 = (long)pSVar1 - (long)pSVar2;
    pSVar3 = pSVar2;
  }
  lVar4 = (lVar5 >> 3) * -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      if (lVar4 != 3) {
        return false;
      }
      dVar10 = ABS(t - pSVar3->t);
      if (dVar10 <= 2.220446049250313e-16) goto LAB_0017b69f;
      dVar9 = ABS(t);
      dVar7 = ABS(pSVar3->t);
      dVar8 = dVar7;
      if (dVar7 <= dVar9) {
        dVar8 = dVar9;
      }
      if (dVar10 <= (double)(~-(ulong)NAN(dVar9) & (ulong)dVar8 | -(ulong)NAN(dVar9) & (ulong)dVar7)
                    * 2.220446049250313e-16) goto LAB_0017b69f;
      pSVar3 = pSVar3 + 1;
    }
    dVar10 = ABS(t - pSVar3->t);
    if (dVar10 <= 2.220446049250313e-16) goto LAB_0017b69f;
    dVar9 = ABS(t);
    dVar7 = ABS(pSVar3->t);
    dVar8 = dVar7;
    if (dVar7 <= dVar9) {
      dVar8 = dVar9;
    }
    if (dVar10 <= (double)(~-(ulong)NAN(dVar9) & (ulong)dVar8 | -(ulong)NAN(dVar9) & (ulong)dVar7) *
                  2.220446049250313e-16) goto LAB_0017b69f;
    pSVar3 = pSVar3 + 1;
  }
  dVar10 = ABS(t - pSVar3->t);
  if (2.220446049250313e-16 < dVar10) {
    dVar7 = ABS(t);
    dVar9 = ABS(pSVar3->t);
    dVar8 = dVar9;
    if (dVar9 <= dVar7) {
      dVar8 = dVar7;
    }
    if ((double)(~-(ulong)NAN(dVar7) & (ulong)dVar8 | -(ulong)NAN(dVar7) & (ulong)dVar9) *
        2.220446049250313e-16 < dVar10) {
      return false;
    }
  }
LAB_0017b69f:
  if (pSVar3 != pSVar1) {
    *dst = pSVar3;
  }
  return false;
}

Assistant:

bool TimeSamples::get_sample_at(const double t, Sample **dst) {
  if (!dst) {
    return false;
  }

  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &sample) {
    return math::is_close(t, sample.t);
  });

  if (it != _samples.end()) {
    (*dst) = &(*it); 
  }
  return false;
}